

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t archive_match_include_date_w(archive *_a,wchar_t flag,wchar_t *datestr)

{
  wchar_t wVar1;
  size_t len;
  time_t mtime_sec;
  int *piVar2;
  char *fmt;
  int error_number;
  archive_string local_38;
  
  wVar1 = validate_time_flag(_a,flag,"archive_match_include_date_w");
  if (wVar1 != L'\0') {
    return wVar1;
  }
  if ((datestr == (wchar_t *)0x0) || (*datestr == L'\0')) {
    fmt = "date is empty";
  }
  else {
    local_38.s = (char *)0x0;
    local_38.length = 0;
    local_38.buffer_length = 0;
    len = wcslen(datestr);
    wVar1 = archive_string_append_from_wcs(&local_38,datestr,len);
    if (wVar1 < L'\0') {
      archive_string_free(&local_38);
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        archive_set_error(_a,0xc,"No memory");
        _a->state = 0x8000;
        return L'\xffffffe2';
      }
      fmt = "Failed to convert WCS to MBS";
      error_number = -1;
      goto LAB_00529476;
    }
    mtime_sec = __archive_get_date((time_t)_a[1].current_code,local_38.s);
    archive_string_free(&local_38);
    if (mtime_sec != -1) {
      set_timefilter((archive_match *)_a,flag,mtime_sec,0,mtime_sec,0);
      return L'\0';
    }
    fmt = "invalid date string";
  }
  error_number = 0x16;
LAB_00529476:
  archive_set_error(_a,error_number,fmt);
  return L'\xffffffe7';
}

Assistant:

int
archive_match_include_date_w(struct archive *_a, int flag,
    const wchar_t *datestr)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_date_w");
	if (r != ARCHIVE_OK)
		return (r);

	return set_timefilter_date_w((struct archive_match *)_a, flag, datestr);
}